

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O3

void __thiscall Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBNoLeafNode *b)

{
  Point *v0;
  Point *v1;
  Point *v2;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  udword uVar5;
  AABBNoLeafNode *b_00;
  MeshInterface *pMVar6;
  IndexedTriangle *pIVar7;
  udword q;
  BOOL BVar8;
  long lVar9;
  ulong uVar10;
  Point *pPVar11;
  udword *puVar12;
  ulong uVar13;
  Point *pPVar14;
  ulong uVar15;
  Point *pPVar16;
  Point *u1;
  udword uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  Point vmax;
  Point local_1a4;
  undefined1 local_198 [8];
  uint uStack_190;
  uint uStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  Container *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  uint uStack_130;
  uint uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f4 [3];
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a4;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  v0 = this->mLeafVerts;
  v1 = this->mLeafVerts + 1;
  v2 = this->mLeafVerts + 2;
  local_170 = &this->mPairs;
  do {
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar36 = this->mLeafVerts[0].x;
    fVar28 = this->mLeafVerts[1].x;
    fVar23 = (b->mAABB).mCenter.x;
    fVar24 = (b->mAABB).mExtents.x;
    local_128 = ZEXT416((uint)fVar36);
    fVar33 = fVar36 - fVar23;
    fVar31 = this->mLeafVerts[2].x;
    local_68 = ZEXT416((uint)fVar28);
    _local_138 = ZEXT416((uint)fVar31);
    local_e8._0_4_ = fVar28 - fVar23;
    local_e8._4_4_ = fVar31 - fVar23;
    if ((float)local_e8._0_4_ <= fVar33) {
      fVar32 = fVar33;
      fVar25 = (float)local_e8._0_4_;
      if ((float)local_e8._4_4_ <= (float)local_e8._0_4_) {
        fVar25 = (float)local_e8._4_4_;
      }
    }
    else {
      fVar32 = (float)local_e8._0_4_;
      fVar25 = fVar33;
      if ((float)local_e8._4_4_ <= fVar33) {
        fVar25 = (float)local_e8._4_4_;
      }
    }
    if (fVar24 < fVar25) {
      return;
    }
    fVar25 = (float)local_e8._4_4_;
    if ((float)local_e8._4_4_ <= fVar32) {
      fVar25 = fVar32;
    }
    if (fVar25 < -fVar24) {
      return;
    }
    fVar32 = this->mLeafVerts[0].y;
    fVar25 = this->mLeafVerts[1].y;
    fVar35 = (b->mAABB).mCenter.y;
    fVar39 = (b->mAABB).mExtents.y;
    _local_148 = ZEXT416((uint)fVar32);
    fVar42 = fVar32 - fVar35;
    fVar19 = this->mLeafVerts[2].y;
    local_88 = ZEXT416((uint)fVar25);
    local_b8 = ZEXT416((uint)fVar19);
    local_158._0_4_ = fVar25 - fVar35;
    local_158._4_4_ = fVar19 - fVar35;
    if ((float)local_158._0_4_ <= fVar42) {
      fVar20 = fVar42;
      fVar22 = (float)local_158._0_4_;
      if ((float)local_158._4_4_ <= (float)local_158._0_4_) {
        fVar22 = (float)local_158._4_4_;
      }
    }
    else {
      fVar20 = (float)local_158._0_4_;
      fVar22 = fVar42;
      if ((float)local_158._4_4_ <= fVar42) {
        fVar22 = (float)local_158._4_4_;
      }
    }
    if (fVar39 < fVar22) {
      return;
    }
    fVar22 = (float)local_158._4_4_;
    if ((float)local_158._4_4_ <= fVar20) {
      fVar22 = fVar20;
    }
    if (fVar22 < -fVar39) {
      return;
    }
    fVar20 = this->mLeafVerts[0].z;
    fVar22 = this->mLeafVerts[1].z;
    fVar26 = (b->mAABB).mCenter.z;
    fVar27 = (b->mAABB).mExtents.z;
    _local_198 = ZEXT416((uint)fVar27);
    local_98 = ZEXT416((uint)fVar22);
    fVar41 = fVar22 - fVar26;
    fVar34 = this->mLeafVerts[2].z;
    local_d8 = ZEXT416((uint)fVar20);
    local_c8 = ZEXT416((uint)fVar34);
    local_188._0_4_ = fVar20 - fVar26;
    local_188._4_4_ = fVar34 - fVar26;
    if (fVar41 <= (float)local_188._0_4_) {
      fVar29 = (float)local_188._0_4_;
      fVar30 = fVar41;
      if ((float)local_188._4_4_ <= fVar41) {
        fVar30 = (float)local_188._4_4_;
      }
    }
    else {
      fVar29 = fVar41;
      fVar30 = (float)local_188._0_4_;
      if ((float)local_188._4_4_ <= (float)local_188._0_4_) {
        fVar30 = (float)local_188._4_4_;
      }
    }
    if (fVar27 < fVar30) {
      return;
    }
    fVar30 = (float)local_188._4_4_;
    if ((float)local_188._4_4_ <= fVar29) {
      fVar30 = fVar29;
    }
    if (fVar30 < -fVar27) {
      return;
    }
    local_168 = ZEXT416((uint)fVar39);
    local_48 = ZEXT416((uint)fVar24);
    fVar30 = (float)local_158._0_4_ - fVar42;
    fVar29 = (float)local_188._4_4_ - fVar41;
    fStack_e0 = 0.0 - fVar23;
    fStack_dc = 0.0 - fVar23;
    fVar38 = (float)local_e8._0_4_ - fVar33;
    fVar40 = (float)local_e8._4_4_ - (float)local_e8._0_4_;
    local_78 = ZEXT416((uint)fVar41);
    fStack_180 = 0.0 - fVar26;
    fStack_17c = 0.0 - fVar26;
    fStack_150 = 0.0 - fVar35;
    fStack_14c = 0.0 - fVar35;
    fVar23 = fVar41 - (float)local_188._0_4_;
    fVar26 = (float)local_158._4_4_ - (float)local_158._0_4_;
    local_58 = -fVar23;
    fStack_54 = -fVar26;
    fStack_50 = -((0.0 - fVar35) - (float)local_188._4_4_);
    fStack_4c = -((0.0 - fVar35) - (float)local_158._4_4_);
    local_a4 = fVar30 * fVar29 - fVar26 * fVar23;
    fVar35 = fVar40 * fVar23 - fVar29 * fVar38;
    fVar37 = fVar38 * fVar26 - fVar40 * fVar30;
    local_a0 = CONCAT44(fVar37,fVar35);
    local_108 = ZEXT416((uint)fVar42);
    local_118 = ZEXT416((uint)fVar33);
    lVar9 = 0;
    do {
      fVar43 = (&(b->mAABB).mExtents.x)[lVar9];
      fVar21 = -fVar43;
      if ((&local_a4)[lVar9] <= 0.0) {
        fVar21 = fVar43;
      }
      uVar18 = -(uint)(0.0 < (&local_a4)[lVar9]);
      (&local_1a4.x)[lVar9] = fVar21;
      local_f4[lVar9] = (float)(~uVar18 & (uint)-fVar43 | (uint)fVar43 & uVar18);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    fVar43 = (-local_a4 * fVar33 - fVar42 * fVar35) - fVar37 * (float)local_188._0_4_;
    if (0.0 < local_1a4.z * fVar37 + local_1a4.x * local_a4 + local_1a4.y * fVar35 + fVar43) {
      return;
    }
    if (fVar43 + local_f4[2] * fVar37 + local_a4 * local_f4[0] + local_f4[1] * fVar35 < 0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      fVar35 = fVar23 * fVar42 + -fVar30 * (float)local_188._0_4_;
      fVar43 = fVar23 * (float)local_158._4_4_ + -fVar30 * (float)local_188._4_4_;
      fVar37 = fVar43;
      if (fVar35 <= fVar43) {
        fVar37 = fVar35;
      }
      fVar21 = ABS(fVar23) * fVar39 + ABS(fVar30) * fVar27;
      if (fVar21 < fVar37) {
        return;
      }
      if (fVar35 <= fVar43) {
        fVar35 = fVar43;
      }
      if (fVar35 < -fVar21) {
        return;
      }
      fVar37 = fVar38 * (float)local_188._0_4_ + local_58 * fVar33;
      fVar43 = fVar38 * (float)local_188._4_4_ + local_58 * (float)local_e8._4_4_;
      fVar35 = fVar43;
      if (fVar37 <= fVar43) {
        fVar35 = fVar37;
      }
      fVar23 = ABS(fVar23) * fVar24 + ABS(fVar38) * fVar27;
      if (fVar23 < fVar35) {
        return;
      }
      if (fVar37 <= fVar43) {
        fVar37 = fVar43;
      }
      if (fVar37 < -fVar23) {
        return;
      }
      fVar35 = fVar30 * (float)local_e8._0_4_ + -fVar38 * (float)local_158._0_4_;
      fVar37 = fVar30 * (float)local_e8._4_4_ + -fVar38 * (float)local_158._4_4_;
      fVar23 = fVar37;
      if (fVar35 <= fVar37) {
        fVar23 = fVar35;
      }
      fVar30 = ABS(fVar30) * fVar24 + ABS(fVar38) * fVar39;
      if (fVar30 < fVar23) {
        return;
      }
      if (fVar35 <= fVar37) {
        fVar35 = fVar37;
      }
      if (fVar35 < -fVar30) {
        return;
      }
      fVar23 = fVar42 * fVar29 - fVar26 * (float)local_188._0_4_;
      fVar30 = (float)local_158._4_4_ * fVar29 - fVar26 * (float)local_188._4_4_;
      fVar35 = fVar30;
      if (fVar23 <= fVar30) {
        fVar35 = fVar23;
      }
      fVar37 = ABS(fVar29) * fVar39 + ABS(fVar26) * fVar27;
      if (fVar37 < fVar35) {
        return;
      }
      if (fVar23 <= fVar30) {
        fVar23 = fVar30;
      }
      if (fVar23 < -fVar37) {
        return;
      }
      fVar35 = (float)local_188._0_4_ * fVar40 - fVar33 * fVar29;
      fVar30 = (float)local_188._4_4_ * fVar40 - (float)local_e8._4_4_ * fVar29;
      fVar23 = fVar30;
      if (fVar35 <= fVar30) {
        fVar23 = fVar35;
      }
      fVar29 = ABS(fVar29) * fVar24 + ABS(fVar40) * fVar27;
      if (fVar29 < fVar23) {
        return;
      }
      if (fVar35 <= fVar30) {
        fVar35 = fVar30;
      }
      if (fVar35 < -fVar29) {
        return;
      }
      fVar35 = fVar26 * fVar33 - fVar42 * fVar40;
      fVar29 = fVar26 * (float)local_e8._0_4_ - fVar40 * (float)local_158._0_4_;
      fVar23 = fVar29;
      if (fVar35 <= fVar29) {
        fVar23 = fVar35;
      }
      fVar26 = ABS(fVar26) * fVar24 + ABS(fVar40) * fVar39;
      if (fVar26 < fVar23) {
        return;
      }
      if (fVar35 <= fVar29) {
        fVar35 = fVar29;
      }
      if (fVar35 < -fVar26) {
        return;
      }
      fVar26 = fVar32 - fVar19;
      fVar29 = fVar20 - fVar34;
      fVar35 = fVar42 * fVar29 - (float)local_188._0_4_ * fVar26;
      fVar42 = fVar29 * (float)local_158._0_4_ - fVar41 * fVar26;
      fVar30 = ABS(fVar29) * fVar39 + fVar27 * ABS(fVar26);
      fVar23 = fVar42;
      if (fVar35 <= fVar42) {
        fVar23 = fVar35;
      }
      if (fVar30 < fVar23) {
        return;
      }
      if (fVar35 <= fVar42) {
        fVar35 = fVar42;
      }
      if (fVar35 < -fVar30) {
        return;
      }
      fVar42 = fVar36 - fVar31;
      fVar33 = fVar42 * (float)local_188._0_4_ - fVar33 * fVar29;
      fVar35 = fVar41 * fVar42 - fVar29 * (float)local_e8._0_4_;
      fVar23 = fVar35;
      if (fVar33 <= fVar35) {
        fVar23 = fVar33;
      }
      fVar27 = ABS(fVar29) * fVar24 + fVar27 * ABS(fVar42);
      if (fVar27 < fVar23) {
        return;
      }
      if (fVar33 <= fVar35) {
        fVar33 = fVar35;
      }
      if (fVar33 < -fVar27) {
        return;
      }
      fVar23 = fVar26 * (float)local_e8._0_4_ - (float)local_158._0_4_ * fVar42;
      fVar35 = fVar26 * (float)local_e8._4_4_ - (float)local_158._4_4_ * fVar42;
      fVar33 = fVar35;
      if (fVar23 <= fVar35) {
        fVar33 = fVar23;
      }
      fVar24 = ABS(fVar26) * fVar24 + ABS(fVar42) * fVar39;
      if (fVar24 < fVar33) {
        return;
      }
      if (fVar23 <= fVar35) {
        fVar23 = fVar35;
      }
      if (fVar23 < -fVar24) {
        return;
      }
    }
    b_00 = (AABBNoLeafNode *)b->mPosData;
    if (((ulong)b_00 & 1) == 0) {
      _CollideBoxTri(this,b_00);
    }
    else {
      pMVar6 = this->mIMesh0;
      uVar17 = (udword)((ulong)b_00 >> 1);
      uVar10 = (ulong)(pMVar6->mTriStride * uVar17);
      pIVar7 = pMVar6->mTris;
      pPVar11 = pMVar6->mVerts;
      uVar5 = pMVar6->mVertexStride;
      uVar13 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar10) * uVar5);
      uVar15 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar10 + 4) * uVar5);
      uVar10 = (ulong)(uVar5 * *(int *)((long)pIVar7->mVRef + uVar10 + 8));
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      local_1a4.x = (fVar25 - fVar32) * (fVar34 - fVar20) - (fVar19 - fVar32) * (fVar22 - fVar20);
      fVar23 = *(float *)((long)&pPVar11->z + uVar13);
      fVar24 = *(float *)((long)&pPVar11->z + uVar15);
      fVar33 = *(float *)((long)&pPVar11->x + uVar10);
      fVar26 = (fVar22 - fVar20) * (fVar31 - fVar36) - (fVar34 - fVar20) * (fVar28 - fVar36);
      fVar27 = (fVar28 - fVar36) * (fVar19 - fVar32) - (fVar31 - fVar36) * (fVar25 - fVar32);
      local_1a4.z = fVar27;
      local_1a4.y = fVar26;
      fVar41 = -fVar27 * fVar20 + (-local_1a4.x * fVar36 - fVar32 * fVar26);
      uVar3 = *(undefined8 *)((long)&pPVar11->x + uVar13);
      uVar2 = *(undefined8 *)((long)&pPVar11->x + uVar15);
      fVar39 = (float)uVar2;
      fVar42 = (float)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)((long)&pPVar11->y + uVar10);
      fVar40 = (float)uVar2;
      fVar43 = (float)((ulong)uVar2 >> 0x20);
      fVar37 = (float)uVar3;
      fVar38 = (float)((ulong)uVar3 >> 0x20);
      fVar35 = fVar43 * fVar27 + local_1a4.x * fVar33 + fVar26 * fVar40 + fVar41;
      fVar29 = fVar41 + fVar23 * fVar27 + fVar37 * local_1a4.x + fVar38 * fVar26;
      local_188._4_4_ = fVar41 + fVar24 * fVar27 + fVar39 * local_1a4.x + fVar42 * fVar26;
      fVar30 = fVar41 + fVar27 * 0.0 + fVar38 * local_1a4.x + fVar26 * 0.0;
      fVar41 = fVar41 + fVar27 * 0.0 + fVar42 * local_1a4.x + fVar26 * 0.0;
      fVar29 = (float)(-(uint)(1e-06 <= ABS(fVar29)) & (uint)fVar29);
      local_188._4_4_ = -(uint)(1e-06 <= ABS((float)local_188._4_4_)) & local_188._4_4_;
      fVar35 = (float)(~-(uint)(ABS(fVar35) < 1e-06) & (uint)fVar35);
      local_188._0_4_ = local_188._4_4_;
      fStack_180 = (float)local_188._4_4_;
      fStack_17c = (float)local_188._4_4_;
      local_198._0_4_ = fVar29 * fVar35;
      if ((fVar29 * (float)local_188._4_4_ <= 0.0) || ((float)local_198._0_4_ <= 0.0)) {
        fVar39 = fVar39 - fVar37;
        fVar24 = fVar24 - fVar23;
        fVar33 = fVar33 - fVar37;
        fVar40 = fVar40 - fVar38;
        fVar43 = fVar43 - fVar23;
        fVar21 = fVar24 * fVar33 - fVar43 * fVar39;
        fVar33 = fVar39 * fVar40 - fVar33 * (fVar42 - fVar38);
        fVar24 = (fVar42 - fVar38) * fVar43 - fVar40 * fVar24;
        local_198._4_4_ = local_188._4_4_;
        uStack_190 = -(uint)(0.0 <= ABS(fVar30)) & (uint)fVar30;
        uStack_18c = -(uint)(0.0 <= ABS(fVar41)) & (uint)fVar41;
        fVar39 = fVar23 * -fVar33 + -fVar24 * fVar37 + -fVar21 * fVar38;
        fVar23 = fVar34 * fVar33 + fVar31 * fVar24 + fVar21 * fVar19 + fVar39;
        fVar28 = fVar22 * fVar33 + fVar28 * fVar24 + fVar21 * fVar25 + fVar39;
        fVar39 = fVar20 * fVar33 + fVar36 * fVar24 + fVar21 * fVar32 + fVar39;
        fVar28 = (float)(-(uint)(1e-06 <= ABS(fVar28)) & (uint)fVar28);
        fVar39 = (float)(-(uint)(1e-06 <= ABS(fVar39)) & (uint)fVar39);
        fVar23 = (float)(~-(uint)(ABS(fVar23) < 1e-06) & (uint)fVar23);
        if ((fVar39 * fVar28 <= 0.0) || (fVar39 * fVar23 <= 0.0)) {
          pPVar14 = (Point *)((long)&pPVar11->x + uVar13);
          pPVar16 = (Point *)((long)&pPVar11->x + uVar15);
          pPVar11 = (Point *)((long)&pPVar11->x + uVar10);
          fVar31 = ABS(fVar33 * fVar26 + fVar21 * -fVar27);
          fVar33 = ABS(fVar24 * fVar27 + fVar33 * -local_1a4.x);
          fVar36 = fVar33;
          if (fVar33 <= fVar31) {
            fVar36 = fVar31;
          }
          uVar18 = (uint)(fVar31 < fVar33);
          if (fVar36 < ABS(local_1a4.x * fVar21 + fVar24 * -fVar26)) {
            uVar18 = 2;
          }
          uVar10 = (ulong)(uVar18 << 2);
          fVar36 = *(float *)((long)&v0->x + uVar10);
          fVar24 = *(float *)((long)&v1->x + uVar10);
          fVar31 = *(float *)((long)&v2->x + uVar10);
          fVar33 = *(float *)((long)&pPVar14->x + uVar10);
          fVar32 = *(float *)((long)&pPVar16->x + uVar10);
          fVar25 = *(float *)((long)&pPVar11->x + uVar10);
          if (0.0 < fVar39 * fVar28) {
            fVar19 = (fVar36 - fVar31) * fVar23;
            fVar42 = (fVar24 - fVar31) * fVar23;
            fVar20 = fVar23 - fVar28;
            fVar23 = fVar23 - fVar39;
            fVar36 = fVar31;
LAB_001b933a:
            if (fVar29 * (float)local_188._4_4_ <= 0.0) {
              if ((float)local_198._0_4_ <= 0.0) {
                if (((fVar29 != 0.0) || (NAN(fVar29))) || (0.0 < (float)local_188._4_4_ * fVar35)) {
                  fVar24 = (fVar25 - fVar33) * fVar29;
                  fVar31 = (fVar32 - fVar33) * fVar29;
                  fVar28 = fVar29 - (float)local_188._4_4_;
                  fVar35 = fVar29 - fVar35;
                  goto LAB_001b93e0;
                }
                if (((float)local_188._4_4_ == 0.0) && (!NAN((float)local_188._4_4_))) {
                  if ((fVar35 == 0.0) && (!NAN(fVar35))) goto LAB_001b9513;
                  goto LAB_001b9345;
                }
              }
              fVar24 = (fVar25 - fVar32) * (float)local_188._4_4_;
              fVar31 = (fVar33 - fVar32) * (float)local_188._4_4_;
              fVar28 = (float)local_188._4_4_ - fVar29;
              fVar35 = (float)local_188._4_4_ - fVar35;
              fVar33 = fVar32;
            }
            else {
LAB_001b9345:
              fVar24 = (fVar32 - fVar25) * fVar35;
              fVar31 = (fVar33 - fVar25) * fVar35;
              fVar28 = fVar35 - fVar29;
              fVar35 = fVar35 - (float)local_188._4_4_;
              fVar33 = fVar25;
            }
LAB_001b93e0:
            fVar25 = fVar23 * fVar20;
            fVar39 = fVar35 * fVar28;
            fVar36 = fVar36 * fVar25 * fVar39;
            fVar32 = fVar36 + fVar39 * fVar19 * fVar20;
            fVar36 = fVar36 + fVar39 * fVar42 * fVar23;
            fVar33 = fVar25 * fVar39 * fVar33;
            fVar23 = fVar25 * fVar24 * fVar28 + fVar33;
            fVar33 = fVar25 * fVar31 * fVar35 + fVar33;
            fVar28 = fVar32;
            if (fVar32 <= fVar36) {
              fVar28 = fVar36;
            }
            fVar24 = fVar23;
            if (fVar33 <= fVar23) {
              fVar24 = fVar33;
            }
            if (fVar24 <= fVar28) {
              if (fVar32 <= fVar36) {
                fVar36 = fVar32;
              }
              if (fVar33 <= fVar23) {
                fVar33 = fVar23;
              }
              if (fVar36 <= fVar33) goto LAB_001b9463;
            }
          }
          else {
            if (0.0 < fVar39 * fVar23) {
LAB_001b92e2:
              fVar19 = (fVar36 - fVar24) * fVar28;
              fVar42 = (fVar31 - fVar24) * fVar28;
              fVar20 = fVar28 - fVar23;
              fVar23 = fVar28 - fVar39;
              fVar36 = fVar24;
              goto LAB_001b933a;
            }
            if (((fVar39 != 0.0) || (NAN(fVar39))) || (0.0 < fVar28 * fVar23)) {
              fVar19 = (fVar24 - fVar36) * fVar39;
              fVar42 = (fVar31 - fVar36) * fVar39;
              fVar20 = fVar39 - fVar23;
              fVar23 = fVar39 - fVar28;
              goto LAB_001b933a;
            }
            if ((fVar28 != 0.0) || (NAN(fVar28))) goto LAB_001b92e2;
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              fVar19 = (fVar36 - fVar31) * fVar23;
              fVar42 = (fVar24 - fVar31) * fVar23;
              fVar20 = fVar23 - fVar28;
              fVar23 = fVar23 - fVar39;
              fVar36 = fVar31;
              goto LAB_001b933a;
            }
LAB_001b9513:
            BVar8 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar14,pPVar16,pPVar11);
            if (BVar8 != 0) {
LAB_001b9463:
              uVar18 = (this->mPairs).mCurNbEntries;
              if (uVar18 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(local_170,1);
                uVar18 = (this->mPairs).mCurNbEntries;
              }
              puVar12 = (this->mPairs).mEntries;
              (this->mPairs).mCurNbEntries = uVar18 + 1;
              puVar12[uVar18] = uVar17;
              uVar18 = (this->mPairs).mCurNbEntries;
              uVar5 = this->mLeafIndex;
              if (uVar18 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(local_170,1);
                puVar12 = (this->mPairs).mEntries;
                uVar18 = (this->mPairs).mCurNbEntries;
              }
              (this->mPairs).mCurNbEntries = uVar18 + 1;
              puVar12[uVar18] = uVar5;
              puVar12 = &(this->super_Collider).mFlags;
              *(byte *)puVar12 = (byte)*puVar12 | 4;
            }
          }
        }
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar6 = this->mIMesh0;
  uVar17 = (udword)((ulong)b >> 1);
  uVar10 = (ulong)(pMVar6->mTriStride * uVar17);
  pIVar7 = pMVar6->mTris;
  uVar5 = pMVar6->mVertexStride;
  uVar13 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar10) * uVar5);
  uVar15 = (ulong)(*(int *)((long)pIVar7->mVRef + uVar10 + 4) * uVar5);
  uVar10 = (ulong)(uVar5 * *(int *)((long)pIVar7->mVRef + uVar10 + 8));
  pPVar14 = pMVar6->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar36 = this->mLeafVerts[1].x;
  fVar28 = this->mLeafVerts[0].x;
  fVar23 = this->mLeafVerts[1].y;
  fVar24 = this->mLeafVerts[1].z;
  pPVar11 = this->mLeafVerts + 2;
  fVar31 = this->mLeafVerts[2].y;
  fVar33 = this->mLeafVerts[2].z;
  fVar32 = *(float *)((long)&pPVar14->z + uVar13);
  _local_188 = ZEXT416((uint)fVar32);
  uVar1 = this->mLeafVerts[0].y;
  uVar4 = this->mLeafVerts[0].z;
  local_108 = ZEXT416((uint)fVar23);
  local_168 = ZEXT416((uint)fVar36);
  fVar35 = pPVar11->x - fVar28;
  local_128 = ZEXT416((uint)fVar31);
  _local_158 = ZEXT416((uint)fVar24);
  fVar39 = fVar33 - (float)uVar4;
  local_1a4.x = (fVar23 - (float)uVar1) * fVar39 - (fVar24 - (float)uVar4) * (fVar31 - (float)uVar1)
  ;
  fVar25 = *(float *)((long)&pPVar14->z + uVar15);
  fVar22 = (fVar24 - (float)uVar4) * fVar35 - fVar39 * (fVar36 - fVar28);
  fVar26 = (fVar31 - (float)uVar1) * (fVar36 - fVar28) - fVar35 * (fVar23 - (float)uVar1);
  _local_e8 = ZEXT416((uint)fVar28);
  fVar35 = *(float *)((long)&pPVar14->x + uVar10);
  local_1a4.z = fVar26;
  local_1a4.y = fVar22;
  fVar39 = (float)uVar4 * -fVar26 + (-local_1a4.x * fVar28 - (float)uVar1 * fVar22);
  uVar3 = *(undefined8 *)((long)&pPVar14->y + uVar10);
  fVar41 = (float)uVar3;
  fVar29 = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((long)&pPVar14->x + uVar13);
  fVar27 = (float)uVar3;
  fVar34 = (float)((ulong)uVar3 >> 0x20);
  uVar3 = *(undefined8 *)((long)&pPVar14->x + uVar15);
  fVar30 = (float)uVar3;
  fVar37 = (float)((ulong)uVar3 >> 0x20);
  fVar42 = fVar29 * fVar26 + local_1a4.x * fVar35 + fVar22 * fVar41 + fVar39;
  fVar19 = fVar39 + fVar32 * fVar26 + fVar27 * local_1a4.x + fVar34 * fVar22;
  local_148._4_4_ = fVar39 + fVar25 * fVar26 + fVar30 * local_1a4.x + fVar37 * fVar22;
  fVar20 = fVar39 + fVar26 * 0.0 + fVar34 * local_1a4.x + fVar22 * 0.0;
  fVar39 = fVar39 + fVar26 * 0.0 + fVar37 * local_1a4.x + fVar22 * 0.0;
  fVar19 = (float)(-(uint)(1e-06 <= ABS(fVar19)) & (uint)fVar19);
  local_148._4_4_ = -(uint)(1e-06 <= ABS((float)local_148._4_4_)) & local_148._4_4_;
  uStack_190 = -(uint)(0.0 <= ABS(fVar20)) & (uint)fVar20;
  uStack_18c = -(uint)(0.0 <= ABS(fVar39)) & (uint)fVar39;
  fVar42 = (float)(~-(uint)(ABS(fVar42) < 1e-06) & (uint)fVar42);
  local_148._0_4_ = local_148._4_4_;
  fStack_140 = (float)local_148._4_4_;
  fStack_13c = (float)local_148._4_4_;
  local_138._0_4_ = fVar19 * (float)local_148._4_4_;
  local_198._0_4_ = fVar19 * fVar42;
  local_198._4_4_ = local_148._4_4_;
  local_138._4_4_ = local_148._4_4_;
  uStack_130 = uStack_190;
  uStack_12c = uStack_18c;
  if ((0.0 < (float)local_138._0_4_) && (0.0 < (float)local_198._0_4_)) {
    return;
  }
  fVar30 = fVar30 - fVar27;
  fVar25 = fVar25 - fVar32;
  fVar35 = fVar35 - fVar27;
  fVar41 = fVar41 - fVar34;
  fVar29 = fVar29 - fVar32;
  fVar39 = fVar25 * fVar35 - fVar29 * fVar30;
  fVar35 = fVar30 * fVar41 - fVar35 * (fVar37 - fVar34);
  fVar25 = (fVar37 - fVar34) * fVar29 - fVar41 * fVar25;
  local_118._0_4_ = (*pPVar11).x;
  fVar32 = fVar32 * -fVar35 + -fVar25 * fVar27 + -fVar39 * fVar34;
  fVar31 = fVar33 * fVar35 + (float)local_118._0_4_ * fVar25 + fVar39 * fVar31 + fVar32;
  fVar36 = fVar24 * fVar35 + fVar36 * fVar25 + fVar39 * fVar23 + fVar32;
  fVar32 = (float)uVar4 * fVar35 + fVar28 * fVar25 + fVar39 * (float)uVar1 + fVar32;
  fVar36 = (float)(-(uint)(1e-06 <= ABS(fVar36)) & (uint)fVar36);
  fVar32 = (float)(-(uint)(1e-06 <= ABS(fVar32)) & (uint)fVar32);
  fVar31 = (float)(~-(uint)(ABS(fVar31) < 1e-06) & (uint)fVar31);
  if ((0.0 < fVar32 * fVar36) && (0.0 < fVar32 * fVar31)) {
    return;
  }
  pPVar16 = (Point *)((long)&pPVar14->x + uVar13);
  u1 = (Point *)((long)&pPVar14->x + uVar15);
  pPVar14 = (Point *)((long)&pPVar14->x + uVar10);
  fVar23 = ABS(fVar35 * fVar22 + fVar39 * -fVar26);
  fVar24 = ABS(fVar25 * fVar26 + fVar35 * -local_1a4.x);
  fVar28 = fVar24;
  if (fVar24 <= fVar23) {
    fVar28 = fVar23;
  }
  uVar18 = 2;
  if (ABS(local_1a4.x * fVar39 + fVar25 * -fVar22) <= fVar28) {
    uVar18 = (uint)(fVar23 < fVar24);
  }
  uVar10 = (ulong)(uVar18 << 2);
  fVar28 = *(float *)((long)&v0->x + uVar10);
  fVar23 = *(float *)((long)&v1->x + uVar10);
  fVar24 = *(float *)((long)&v2->x + uVar10);
  fVar33 = *(float *)((long)&pPVar16->x + uVar10);
  fVar25 = *(float *)((long)&u1->x + uVar10);
  fVar35 = *(float *)((long)&pPVar14->x + uVar10);
  local_118 = *(undefined1 (*) [16])pPVar11;
  if (fVar32 * fVar36 <= 0.0) {
    if (0.0 < fVar32 * fVar31) {
LAB_001b9a06:
      fVar20 = (fVar28 - fVar23) * fVar36;
      fVar22 = (fVar24 - fVar23) * fVar36;
      fVar39 = fVar36 - fVar31;
      fVar31 = fVar36 - fVar32;
      fVar28 = fVar23;
      goto LAB_001b9a5a;
    }
    if (((fVar32 != 0.0) || (NAN(fVar32))) || (0.0 < fVar36 * fVar31)) {
      fVar20 = (fVar23 - fVar28) * fVar32;
      fVar22 = (fVar24 - fVar28) * fVar32;
      fVar39 = fVar32 - fVar31;
      fVar31 = fVar32 - fVar36;
      goto LAB_001b9a5a;
    }
    if ((fVar36 != 0.0) || (NAN(fVar36))) goto LAB_001b9a06;
    if ((fVar31 != 0.0) || (NAN(fVar31))) goto LAB_001b99b5;
LAB_001b9c10:
    BVar8 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar16,u1,pPVar14);
    if (BVar8 == 0) {
      return;
    }
    goto LAB_001b9b80;
  }
LAB_001b99b5:
  fVar20 = (fVar28 - fVar24) * fVar31;
  fVar22 = (fVar23 - fVar24) * fVar31;
  fVar39 = fVar31 - fVar36;
  fVar31 = fVar31 - fVar32;
  fVar28 = fVar24;
LAB_001b9a5a:
  if ((float)local_138._0_4_ <= 0.0) {
    if ((float)local_198._0_4_ <= 0.0) {
      if (((fVar19 != 0.0) || (NAN(fVar19))) || (0.0 < (float)local_148._4_4_ * fVar42)) {
        fVar23 = (fVar35 - fVar33) * fVar19;
        fVar24 = (fVar25 - fVar33) * fVar19;
        fVar36 = fVar19 - (float)local_148._4_4_;
        fVar42 = fVar19 - fVar42;
        goto LAB_001b9b0c;
      }
      if (((float)local_148._4_4_ == 0.0) && (!NAN((float)local_148._4_4_))) {
        if ((fVar42 == 0.0) && (!NAN(fVar42))) goto LAB_001b9c10;
        goto LAB_001b9a6a;
      }
    }
    fVar23 = (fVar35 - fVar25) * (float)local_148._4_4_;
    fVar24 = (fVar33 - fVar25) * (float)local_148._4_4_;
    fVar36 = (float)local_148._4_4_ - fVar19;
    fVar42 = (float)local_148._4_4_ - fVar42;
    fVar33 = fVar25;
  }
  else {
LAB_001b9a6a:
    fVar23 = (fVar25 - fVar35) * fVar42;
    fVar24 = (fVar33 - fVar35) * fVar42;
    fVar36 = fVar42 - fVar19;
    fVar42 = fVar42 - (float)local_148._4_4_;
    fVar33 = fVar35;
  }
LAB_001b9b0c:
  fVar32 = fVar31 * fVar39;
  fVar25 = fVar42 * fVar36;
  fVar28 = fVar28 * fVar32 * fVar25;
  fVar35 = fVar28 + fVar25 * fVar20 * fVar39;
  fVar28 = fVar28 + fVar25 * fVar22 * fVar31;
  fVar33 = fVar32 * fVar25 * fVar33;
  fVar23 = fVar32 * fVar23 * fVar36 + fVar33;
  fVar33 = fVar32 * fVar24 * fVar42 + fVar33;
  fVar36 = fVar35;
  if (fVar35 <= fVar28) {
    fVar36 = fVar28;
  }
  fVar24 = fVar23;
  if (fVar33 <= fVar23) {
    fVar24 = fVar33;
  }
  if (fVar36 < fVar24) {
    return;
  }
  if (fVar35 <= fVar28) {
    fVar28 = fVar35;
  }
  if (fVar33 <= fVar23) {
    fVar33 = fVar23;
  }
  if (fVar33 < fVar28) {
    return;
  }
LAB_001b9b80:
  uVar18 = (this->mPairs).mCurNbEntries;
  if (uVar18 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(local_170,1);
    uVar18 = (this->mPairs).mCurNbEntries;
  }
  puVar12 = (this->mPairs).mEntries;
  (this->mPairs).mCurNbEntries = uVar18 + 1;
  puVar12[uVar18] = uVar17;
  uVar18 = (this->mPairs).mCurNbEntries;
  uVar5 = this->mLeafIndex;
  if (uVar18 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(local_170,1);
    puVar12 = (this->mPairs).mEntries;
    uVar18 = (this->mPairs).mCurNbEntries;
  }
  (this->mPairs).mCurNbEntries = uVar18 + 1;
  puVar12[uVar18] = uVar5;
  puVar12 = &(this->super_Collider).mFlags;
  *(byte *)puVar12 = (byte)*puVar12 | 4;
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBNoLeafNode* b)
{
	// Perform triangle-box overlap test
	if(!TriBoxOverlap(b->mAABB.mCenter, b->mAABB.mExtents))	return;

	// Keep same triangle, deal with first child
	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	// Keep same triangle, deal with second child
	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}